

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall tinyusdz::GPrim::set_primvar(GPrim *this,GeomPrimvar *primvar,string *err)

{
  byte bVar1;
  bool bVar2;
  Attribute *pAVar3;
  AttrMeta *pAVar4;
  mapped_type *pmVar5;
  vector<int,_std::allocator<int>_> *v;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this_00;
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  *this_01;
  reference pSVar6;
  Property local_12b8;
  undefined1 local_cd8 [8];
  string index_name;
  Attribute indices;
  Sample *sample;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  *__range3;
  PrimVar var;
  uint32_t local_3d0;
  optional<unsigned_int> local_3cc;
  Interpolation local_3c4;
  optional<tinyusdz::Interpolation> local_3c0;
  undefined1 local_3b8 [8];
  Attribute attr;
  undefined1 local_f0 [8];
  string primvar_name;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68;
  string local_48;
  string *local_28;
  string *err_local;
  GeomPrimvar *primvar_local;
  GPrim *this_local;
  
  local_28 = err;
  err_local = &primvar->_name;
  primvar_local = (GeomPrimvar *)this;
  GeomPrimvar::name_abi_cxx11_(&local_48,primvar);
  bVar1 = ::std::__cxx11::string::empty();
  ::std::__cxx11::string::~string((string *)&local_48);
  if ((bVar1 & 1) == 0) {
    GeomPrimvar::name_abi_cxx11_(&local_68,(GeomPrimvar *)err_local);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_88,"primvars:",&local_89);
    bVar2 = startsWith((string *)&local_68,(string *)local_88);
    ::std::__cxx11::string::~string(local_88);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
    ::std::__cxx11::string::~string((string *)&local_68);
    if (bVar2) {
      if (local_28 != (string *)0x0) {
        GeomPrimvar::name_abi_cxx11_
                  ((string *)((long)&primvar_name.field_2 + 8),(GeomPrimvar *)err_local);
        ::std::operator+((char *)local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "GeomPrimvar.name must not start with `primvars:` namespace. name = ");
        ::std::__cxx11::string::operator+=((string *)local_28,local_b0);
        ::std::__cxx11::string::~string(local_b0);
        ::std::__cxx11::string::~string((string *)(primvar_name.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = 0;
    }
    else {
      GeomPrimvar::name_abi_cxx11_
                ((string *)
                 &attr._metas.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(GeomPrimvar *)err_local);
      ::std::operator+(local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x9f2a06);
      ::std::__cxx11::string::~string
                ((string *)
                 &attr._metas.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pAVar3 = GeomPrimvar::get_attribute((GeomPrimvar *)err_local);
      Attribute::Attribute((Attribute *)local_3b8,pAVar3);
      bVar2 = GeomPrimvar::has_interpolation((GeomPrimvar *)err_local);
      if (bVar2) {
        local_3c4 = GeomPrimvar::get_interpolation((GeomPrimvar *)err_local);
        nonstd::optional_lite::optional<tinyusdz::Interpolation>::
        optional<tinyusdz::Interpolation,_0>(&local_3c0,&local_3c4);
        pAVar4 = Attribute::metas((Attribute *)local_3b8);
        nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
                  (&pAVar4->interpolation,&local_3c0);
        nonstd::optional_lite::optional<tinyusdz::Interpolation>::~optional(&local_3c0);
      }
      bVar2 = GeomPrimvar::has_elementSize((GeomPrimvar *)err_local);
      if (bVar2) {
        local_3d0 = GeomPrimvar::get_elementSize((GeomPrimvar *)err_local);
        nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>
                  (&local_3cc,&local_3d0);
        pAVar4 = Attribute::metas((Attribute *)local_3b8);
        nonstd::optional_lite::optional<unsigned_int>::operator=(&pAVar4->elementSize,&local_3cc);
        nonstd::optional_lite::optional<unsigned_int>::~optional(&local_3cc);
      }
      Property::Property((Property *)&var._ts._dirty,(Attribute *)local_3b8,false);
      pmVar5 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&this->props,(key_type *)local_f0);
      Property::operator=(pmVar5,(Property *)&var._ts._dirty);
      Property::~Property((Property *)&var._ts._dirty);
      tinyusdz::primvar::PrimVar::PrimVar((PrimVar *)&__range3);
      bVar2 = GeomPrimvar::has_default_indices((GeomPrimvar *)err_local);
      if (bVar2) {
        v = GeomPrimvar::get_default_indices((GeomPrimvar *)err_local);
        tinyusdz::primvar::PrimVar::set_value<std::vector<int,std::allocator<int>>>
                  ((PrimVar *)&__range3,v);
      }
      bVar2 = GeomPrimvar::has_timesampled_indices((GeomPrimvar *)err_local);
      if (bVar2) {
        this_00 = GeomPrimvar::get_timesampled_indices((GeomPrimvar *)err_local);
        this_01 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::get_samples(this_00);
        __end3 = ::std::
                 vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                 ::begin(this_01);
        sample = (Sample *)
                 ::std::
                 vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                 ::end(this_01);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
                                           *)&sample), bVar2) {
          pSVar6 = __gnu_cxx::
                   __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
                   ::operator*(&__end3);
          tinyusdz::primvar::PrimVar::set_timesample<std::vector<int,std::allocator<int>>>
                    ((PrimVar *)&__range3,pSVar6->t,&pSVar6->value);
          __gnu_cxx::
          __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
          ::operator++(&__end3);
        }
      }
      bVar2 = GeomPrimvar::has_default_indices((GeomPrimvar *)err_local);
      if ((bVar2) || (bVar2 = GeomPrimvar::has_timesampled_indices((GeomPrimvar *)err_local), bVar2)
         ) {
        Attribute::Attribute((Attribute *)((long)&index_name.field_2 + 8));
        Attribute::set_var((Attribute *)((long)&index_name.field_2 + 8),(PrimVar *)&__range3);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_cd8,local_f0);
        Property::Property(&local_12b8,(Attribute *)((long)&index_name.field_2 + 8),false);
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](&this->props,(key_type *)local_cd8);
        Property::operator=(pmVar5,&local_12b8);
        Property::~Property(&local_12b8);
        ::std::__cxx11::string::~string((string *)local_cd8);
        Attribute::~Attribute((Attribute *)((long)&index_name.field_2 + 8));
      }
      tinyusdz::primvar::PrimVar::~PrimVar((PrimVar *)&__range3);
      this_local._7_1_ = 1;
      Attribute::~Attribute((Attribute *)local_3b8);
      ::std::__cxx11::string::~string((string *)local_f0);
    }
  }
  else {
    if (local_28 != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)local_28,"GeomPrimvar.name is empty.");
    }
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GPrim::set_primvar(const GeomPrimvar &primvar,
                        std::string *err) {
  if (primvar.name().empty()) {
    if (err) {
      (*err) += "GeomPrimvar.name is empty.";
    }
    return false;
  }

  if (startsWith(primvar.name(), "primvars:")) {
    if (err) {
      (*err) += "GeomPrimvar.name must not start with `primvars:` namespace. name = " + primvar.name();
    }
    return false;
  }

  std::string primvar_name = kPrimvars + primvar.name();

  // Overwrite existing primvar prop.
  // TODO: Report warn when primvar name already exists.

  Attribute attr = primvar.get_attribute();

  if (primvar.has_interpolation()) {
    attr.metas().interpolation = primvar.get_interpolation();
  }

  if (primvar.has_elementSize()) {
    attr.metas().elementSize = primvar.get_elementSize();
  }

  props[primvar_name] = attr;

  {
    primvar::PrimVar var;

    if (primvar.has_default_indices()) {
      var.set_value(primvar.get_default_indices());
    }

    if (primvar.has_timesampled_indices()) {
      for (const auto &sample : primvar.get_timesampled_indices().get_samples()) {
        var.set_timesample(sample.t, sample.value);
      }
    }

    if (primvar.has_default_indices() || primvar.has_timesampled_indices()) {
      Attribute indices;
      indices.set_var(var);
      std::string index_name = primvar_name + kIndices;
      props[index_name] = indices;
    }

  }

  return true;
}